

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastUInt32ToBufferLeft(uint32 u,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  if (u < 1000000000) {
    if (99 < u) {
      if (9999 < u) {
        if (999999 < u) {
          if (99999999 < u) {
            uVar3 = (ulong)u / 100000000;
            *buffer = (byte)(u / 100000000) | 0x30;
            buffer = buffer + 1;
            goto LAB_002c1325;
          }
          if (9999999 < u) goto LAB_002c132d;
          uVar3 = (ulong)u / 1000000;
          *buffer = (char)(u / 1000000) + '0';
          buffer = buffer + 1;
          goto LAB_002c134c;
        }
        if (99999 < u) goto LAB_002c1354;
        uVar3 = (ulong)u / 10000;
        *buffer = (byte)(u / 10000) | 0x30;
        buffer = buffer + 1;
        goto LAB_002c1375;
      }
      if (999 < u) goto LAB_002c137d;
      uVar2 = (u & 0xffff) / 100;
      uVar3 = (ulong)uVar2;
      *buffer = (byte)uVar2 | 0x30;
      buffer = buffer + 1;
      goto LAB_002c139c;
    }
    if (u < 10) {
      *buffer = (byte)u | 0x30;
      pcVar1 = buffer + 1;
      goto LAB_002c13b5;
    }
  }
  else {
    uVar3 = (ulong)u / 100000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c1325:
    u = u + (int)uVar3 * -100000000;
LAB_002c132d:
    uVar3 = (ulong)u / 1000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c134c:
    u = u + (int)uVar3 * -1000000;
LAB_002c1354:
    uVar3 = (ulong)u / 10000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c1375:
    u = u + (int)uVar3 * -10000;
LAB_002c137d:
    uVar3 = (ulong)u / 100;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c139c:
    u = u + (int)uVar3 * -100;
  }
  *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + (ulong)u * 2);
  pcVar1 = buffer + 2;
LAB_002c13b5:
  *pcVar1 = '\0';
  return pcVar1;
}

Assistant:

char* FastUInt32ToBufferLeft(uint32 u, char* buffer) {
  uint32 digits;
  const char *ASCII_digits = nullptr;
  // The idea of this implementation is to trim the number of divides to as few
  // as possible by using multiplication and subtraction rather than mod (%),
  // and by outputting two digits at a time rather than one.
  // The huge-number case is first, in the hopes that the compiler will output
  // that case in one branch-free block of code, and only output conditional
  // branches into it from below.
  if (u >= 1000000000) {  // >= 1,000,000,000
    digits = u / 100000000;  // 100,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100_000_000:
    u -= digits * 100000000;  // 100,000,000
lt100_000_000:
    digits = u / 1000000;  // 1,000,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt1_000_000:
    u -= digits * 1000000;  // 1,000,000
lt1_000_000:
    digits = u / 10000;  // 10,000
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt10_000:
    u -= digits * 10000;  // 10,000
lt10_000:
    digits = u / 100;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
sublt100:
    u -= digits * 100;
lt100:
    digits = u;
    ASCII_digits = two_ASCII_digits[digits];
    buffer[0] = ASCII_digits[0];
    buffer[1] = ASCII_digits[1];
    buffer += 2;
done:
    *buffer = 0;
    return buffer;
  }

  if (u < 100) {
    digits = u;
    if (u >= 10) goto lt100;
    *buffer++ = '0' + digits;
    goto done;
  }
  if (u  <  10000) {   // 10,000
    if (u >= 1000) goto lt10_000;
    digits = u / 100;
    *buffer++ = '0' + digits;
    goto sublt100;
  }
  if (u  <  1000000) {   // 1,000,000
    if (u >= 100000) goto lt1_000_000;
    digits = u / 10000;  //    10,000
    *buffer++ = '0' + digits;
    goto sublt10_000;
  }
  if (u  <  100000000) {   // 100,000,000
    if (u >= 10000000) goto lt100_000_000;
    digits = u / 1000000;  //   1,000,000
    *buffer++ = '0' + digits;
    goto sublt1_000_000;
  }
  // we already know that u < 1,000,000,000
  digits = u / 100000000;   // 100,000,000
  *buffer++ = '0' + digits;
  goto sublt100_000_000;
}